

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O3

idx_t duckdb::FindRangeBound<duckdb::GreaterThan,false>
                (WindowCursor *range_lo,WindowCursor *range_hi,idx_t order_begin,idx_t order_end,
                WindowBoundary range,WindowInputExpression *boundary,idx_t chunk_idx,
                FrameBounds *prev)

{
  PhysicalType PVar1;
  byte bVar2;
  data_t dVar3;
  short sVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [12];
  byte bVar11;
  char cVar12;
  bool bVar13;
  short sVar14;
  unsigned_short uVar15;
  uint uVar16;
  int iVar17;
  int64_t ldays;
  reference pvVar18;
  OutOfRangeException *pOVar19;
  unsigned_long uVar20;
  InternalException *this;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  idx_t iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int64_t lmicros;
  float fVar29;
  hugeint_t hVar30;
  interval_t iVar31;
  WindowColumnIterator<unsigned_long> WVar32;
  WindowColumnIterator<short> WVar33;
  WindowColumnIterator<unsigned_int> WVar34;
  WindowColumnIterator<signed_char> WVar35;
  WindowColumnIterator<unsigned_short> WVar36;
  WindowColumnIterator<unsigned_char> WVar37;
  WindowColumnIterator<int> WVar38;
  WindowColumnIterator<double> WVar39;
  WindowColumnIterator<long> WVar40;
  WindowColumnIterator<float> WVar41;
  WindowColumnIterator<duckdb::uhugeint_t> WVar42;
  WindowColumnIterator<duckdb::hugeint_t> WVar43;
  WindowColumnIterator<duckdb::interval_t> WVar44;
  WindowColumnIterator<unsigned_long> __last;
  WindowColumnIterator<short> __last_00;
  WindowColumnIterator<unsigned_int> __last_01;
  WindowColumnIterator<signed_char> __last_02;
  WindowColumnIterator<unsigned_short> __last_03;
  WindowColumnIterator<unsigned_char> __last_04;
  WindowColumnIterator<int> __last_05;
  WindowColumnIterator<double> __last_06;
  WindowColumnIterator<long> __last_07;
  WindowColumnIterator<float> __last_08;
  WindowColumnIterator<duckdb::uhugeint_t> __last_09;
  WindowColumnIterator<duckdb::hugeint_t> __last_10;
  WindowColumnIterator<duckdb::interval_t> __last_11;
  OperationCompare<unsigned_char,_duckdb::GreaterThan> comp;
  uchar val;
  double cur_val;
  _Any_data local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  idx_t local_80;
  _Any_data local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  interval_t local_58;
  long local_48;
  uhugeint_t local_40;
  
  auVar10 = (undefined1  [12])local_40._4_12_;
  PVar1 = boundary->ptype;
  local_80 = order_end;
  switch(PVar1) {
  case UINT8:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar24 = local_80;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    bVar2 = pvVar18->data[chunk_idx];
    local_58.months._0_1_ = bVar2;
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      bVar11 = WindowCursor::GetCell<unsigned_char>(range_hi,0,local_80 - 1);
      if (bVar2 < bVar11) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      bVar11 = WindowCursor::GetCell<unsigned_char>(range_lo,0,order_begin);
      iVar24 = local_80;
      if (bVar11 < bVar2) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar22 = prev->end;
    if (uVar8 < uVar22) {
      if (uVar8 < iVar24 && order_begin <= uVar8) {
        WindowCursor::GetCell<unsigned_char>(range_lo,0,uVar8);
        uVar22 = prev->end;
      }
      if (uVar22 < iVar24 && order_begin < uVar22) {
        bVar11 = WindowCursor::GetCell<unsigned_char>(range_hi,0,uVar22 - 1);
        if (bVar11 <= bVar2) {
          iVar24 = prev->end;
          if (bVar2 <= bVar11) goto LAB_011b0289;
          iVar24 = iVar24 + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_char,_unsigned_char)>::function
              ((function<bool_(unsigned_char,_unsigned_char)> *)&local_a0,
               (function<bool_(unsigned_char,_unsigned_char)> *)&local_78);
    WVar37.pos = order_begin;
    WVar37.coll = range_lo;
    __last_04.pos = iVar24;
    __last_04.coll = range_hi;
    WVar37 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_char>,unsigned_char,duckdb::OperationCompare<unsigned_char,duckdb::GreaterThan>>
                       (WVar37,__last_04,(uchar *)&local_58,
                        (OperationCompare<unsigned_char,_duckdb::GreaterThan> *)&local_a0);
    iVar24 = WVar37.pos;
    if ((code *)local_90._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_90._M_allocated_capacity)(&local_a0,&local_a0,3);
    }
LAB_011b0289:
    if ((code *)local_68._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    }
    return iVar24;
  case INT8:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar24 = local_80;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    dVar3 = pvVar18->data[chunk_idx];
    local_58.months._0_1_ = dVar3;
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      cVar12 = WindowCursor::GetCell<signed_char>(range_hi,0,local_80 - 1);
      if ((char)dVar3 < cVar12) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cVar12 = WindowCursor::GetCell<signed_char>(range_lo,0,order_begin);
      iVar24 = local_80;
      if (cVar12 < (char)dVar3) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar22 = prev->end;
    if (uVar8 < uVar22) {
      if (uVar8 < iVar24 && order_begin <= uVar8) {
        WindowCursor::GetCell<signed_char>(range_lo,0,uVar8);
        uVar22 = prev->end;
      }
      if ((uVar22 < iVar24 && order_begin < uVar22) &&
         (cVar12 = WindowCursor::GetCell<signed_char>(range_hi,0,uVar22 - 1), cVar12 <= (char)dVar3)
         ) {
        iVar24 = prev->end;
        if ((char)dVar3 <= cVar12) goto LAB_011afe8e;
        iVar24 = iVar24 + 1;
      }
    }
    ::std::function<bool_(signed_char,_signed_char)>::function
              ((function<bool_(signed_char,_signed_char)> *)&local_a0,
               (function<bool_(signed_char,_signed_char)> *)&local_78);
    WVar35.pos = order_begin;
    WVar35.coll = range_lo;
    __last_02.pos = iVar24;
    __last_02.coll = range_hi;
    WVar35 = ::std::
             upper_bound<duckdb::WindowColumnIterator<signed_char>,signed_char,duckdb::OperationCompare<signed_char,duckdb::GreaterThan>>
                       (WVar35,__last_02,(char *)&local_58,
                        (OperationCompare<signed_char,_duckdb::GreaterThan> *)&local_a0);
    iVar24 = WVar35.pos;
    if ((code *)local_90._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_90._M_allocated_capacity)(&local_a0,&local_a0,3);
    }
LAB_011afe8e:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar24;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar24;
  case UINT16:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar24 = local_80;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    uVar5 = *(ushort *)(pvVar18->data + chunk_idx * 2);
    local_58.months._0_2_ = uVar5;
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar15 = WindowCursor::GetCell<unsigned_short>(range_hi,0,local_80 - 1);
      if (uVar5 < uVar15) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar15 = WindowCursor::GetCell<unsigned_short>(range_lo,0,order_begin);
      iVar24 = local_80;
      if (uVar15 < uVar5) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar22 = prev->end;
    if (uVar8 < uVar22) {
      if (uVar8 < iVar24 && order_begin <= uVar8) {
        WindowCursor::GetCell<unsigned_short>(range_lo,0,uVar8);
        uVar22 = prev->end;
      }
      if (uVar22 < iVar24 && order_begin < uVar22) {
        uVar15 = WindowCursor::GetCell<unsigned_short>(range_hi,0,uVar22 - 1);
        if (uVar15 <= uVar5) {
          iVar24 = prev->end;
          if (uVar5 <= uVar15) goto LAB_011b01a3;
          iVar24 = iVar24 + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_short,_unsigned_short)>::function
              ((function<bool_(unsigned_short,_unsigned_short)> *)&local_a0,
               (function<bool_(unsigned_short,_unsigned_short)> *)&local_78);
    WVar36.pos = order_begin;
    WVar36.coll = range_lo;
    __last_03.pos = iVar24;
    __last_03.coll = range_hi;
    WVar36 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_short>,unsigned_short,duckdb::OperationCompare<unsigned_short,duckdb::GreaterThan>>
                       (WVar36,__last_03,(unsigned_short *)&local_58,
                        (OperationCompare<unsigned_short,_duckdb::GreaterThan> *)&local_a0);
    iVar24 = WVar36.pos;
    if ((code *)local_90._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_90._M_allocated_capacity)(&local_a0,&local_a0,3);
    }
LAB_011b01a3:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar24;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar24;
  case INT16:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar24 = local_80;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    sVar4 = *(short *)(pvVar18->data + chunk_idx * 2);
    local_58.months._0_2_ = sVar4;
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      sVar14 = WindowCursor::GetCell<short>(range_hi,0,local_80 - 1);
      if (sVar4 < sVar14) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      sVar14 = WindowCursor::GetCell<short>(range_lo,0,order_begin);
      iVar24 = local_80;
      if (sVar14 < sVar4) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar22 = prev->end;
    if (uVar8 < uVar22) {
      if (uVar8 < iVar24 && order_begin <= uVar8) {
        WindowCursor::GetCell<short>(range_lo,0,uVar8);
        uVar22 = prev->end;
      }
      if ((uVar22 < iVar24 && order_begin < uVar22) &&
         (sVar14 = WindowCursor::GetCell<short>(range_hi,0,uVar22 - 1), sVar14 <= sVar4)) {
        iVar24 = prev->end;
        if (sVar4 <= sVar14) goto LAB_011afcc2;
        iVar24 = iVar24 + 1;
      }
    }
    ::std::function<bool_(short,_short)>::function
              ((function<bool_(short,_short)> *)&local_a0,(function<bool_(short,_short)> *)&local_78
              );
    WVar33.pos = order_begin;
    WVar33.coll = range_lo;
    __last_00.pos = iVar24;
    __last_00.coll = range_hi;
    WVar33 = ::std::
             upper_bound<duckdb::WindowColumnIterator<short>,short,duckdb::OperationCompare<short,duckdb::GreaterThan>>
                       (WVar33,__last_00,(short *)&local_58,
                        (OperationCompare<short,_duckdb::GreaterThan> *)&local_a0);
    iVar24 = WVar33.pos;
    if ((code *)local_90._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_90._M_allocated_capacity)(&local_a0,&local_a0,3);
    }
LAB_011afcc2:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar24;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar24;
  case UINT32:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar24 = local_80;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    uVar6 = *(uint *)(pvVar18->data + chunk_idx * 4);
    local_58.months = uVar6;
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar16 = WindowCursor::GetCell<unsigned_int>(range_hi,0,local_80 - 1);
      if (uVar6 < uVar16) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar16 = WindowCursor::GetCell<unsigned_int>(range_lo,0,order_begin);
      iVar24 = local_80;
      if (uVar16 < uVar6) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar22 = prev->end;
    if (uVar8 < uVar22) {
      if (uVar8 < iVar24 && order_begin <= uVar8) {
        WindowCursor::GetCell<unsigned_int>(range_lo,0,uVar8);
        uVar22 = prev->end;
      }
      if (uVar22 < iVar24 && order_begin < uVar22) {
        uVar16 = WindowCursor::GetCell<unsigned_int>(range_hi,0,uVar22 - 1);
        if (uVar16 <= uVar6) {
          iVar24 = prev->end;
          if (uVar6 <= uVar16) goto LAB_011afda8;
          iVar24 = iVar24 + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_int,_unsigned_int)>::function
              ((function<bool_(unsigned_int,_unsigned_int)> *)&local_a0,
               (function<bool_(unsigned_int,_unsigned_int)> *)&local_78);
    WVar34.pos = order_begin;
    WVar34.coll = range_lo;
    __last_01.pos = iVar24;
    __last_01.coll = range_hi;
    WVar34 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_int>,unsigned_int,duckdb::OperationCompare<unsigned_int,duckdb::GreaterThan>>
                       (WVar34,__last_01,(uint *)&local_58,
                        (OperationCompare<unsigned_int,_duckdb::GreaterThan> *)&local_a0);
    iVar24 = WVar34.pos;
    if ((code *)local_90._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_90._M_allocated_capacity)(&local_a0,&local_a0,3);
    }
LAB_011afda8:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar24;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar24;
  case INT32:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar24 = local_80;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    iVar7 = *(int *)(pvVar18->data + chunk_idx * 4);
    local_58.months = iVar7;
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      iVar17 = WindowCursor::GetCell<int>(range_hi,0,local_80 - 1);
      if (iVar7 < iVar17) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      iVar17 = WindowCursor::GetCell<int>(range_lo,0,order_begin);
      iVar24 = local_80;
      if (iVar17 < iVar7) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar22 = prev->end;
    if (uVar8 < uVar22) {
      if (uVar8 < iVar24 && order_begin <= uVar8) {
        WindowCursor::GetCell<int>(range_lo,0,uVar8);
        uVar22 = prev->end;
      }
      if ((uVar22 < iVar24 && order_begin < uVar22) &&
         (iVar17 = WindowCursor::GetCell<int>(range_hi,0,uVar22 - 1), iVar17 <= iVar7)) {
        iVar24 = prev->end;
        if (iVar7 <= iVar17) goto LAB_011b036f;
        iVar24 = iVar24 + 1;
      }
    }
    ::std::function<bool_(int,_int)>::function
              ((function<bool_(int,_int)> *)&local_a0,(function<bool_(int,_int)> *)&local_78);
    WVar38.pos = order_begin;
    WVar38.coll = range_lo;
    __last_05.pos = iVar24;
    __last_05.coll = range_hi;
    WVar38 = ::std::
             upper_bound<duckdb::WindowColumnIterator<int>,int,duckdb::OperationCompare<int,duckdb::GreaterThan>>
                       (WVar38,__last_05,&local_58.months,
                        (OperationCompare<int,_duckdb::GreaterThan> *)&local_a0);
    iVar24 = WVar38.pos;
    if ((code *)local_90._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_90._M_allocated_capacity)(&local_a0,&local_a0,3);
    }
LAB_011b036f:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar24;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar24;
  case UINT64:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar24 = local_80;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    uVar8 = *(ulong *)(pvVar18->data + chunk_idx * 8);
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_58._0_8_ = uVar8;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar20 = WindowCursor::GetCell<unsigned_long>(range_hi,0,local_80 - 1);
      if (uVar8 < uVar20) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar20 = WindowCursor::GetCell<unsigned_long>(range_lo,0,order_begin);
      iVar24 = local_80;
      if (uVar20 < uVar8) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar22 = prev->start;
    uVar23 = prev->end;
    if (uVar22 < uVar23) {
      if (uVar22 < iVar24 && order_begin <= uVar22) {
        WindowCursor::GetCell<unsigned_long>(range_lo,0,uVar22);
        uVar23 = prev->end;
      }
      if (uVar23 < iVar24 && order_begin < uVar23) {
        uVar20 = WindowCursor::GetCell<unsigned_long>(range_hi,0,uVar23 - 1);
        if (uVar20 <= uVar8) {
          iVar24 = prev->end;
          if (uVar8 <= uVar20) goto LAB_011afbda;
          iVar24 = iVar24 + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_long,_unsigned_long)>::function
              ((function<bool_(unsigned_long,_unsigned_long)> *)&local_a0,
               (function<bool_(unsigned_long,_unsigned_long)> *)&local_78);
    WVar32.pos = order_begin;
    WVar32.coll = range_lo;
    __last.pos = iVar24;
    __last.coll = range_hi;
    WVar32 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_long>,unsigned_long,duckdb::OperationCompare<unsigned_long,duckdb::GreaterThan>>
                       (WVar32,__last,(unsigned_long *)&local_58,
                        (OperationCompare<unsigned_long,_duckdb::GreaterThan> *)&local_a0);
    iVar24 = WVar32.pos;
    if ((code *)local_90._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_90._M_allocated_capacity)(&local_a0,&local_a0,3);
    }
LAB_011afbda:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar24;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar24;
  case INT64:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar24 = local_80;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    lVar9 = *(long *)(pvVar18->data + chunk_idx * 8);
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_58._0_8_ = lVar9;
    if (range == EXPR_PRECEDING_RANGE) {
      lVar26 = WindowCursor::GetCell<long>(range_hi,0,local_80 - 1);
      if (lVar9 < lVar26) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      lVar26 = WindowCursor::GetCell<long>(range_lo,0,order_begin);
      iVar24 = local_80;
      if (lVar26 < lVar9) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar22 = prev->end;
    if (uVar8 < uVar22) {
      if (uVar8 < iVar24 && order_begin <= uVar8) {
        WindowCursor::GetCell<long>(range_lo,0,uVar8);
        uVar22 = prev->end;
      }
      if ((uVar22 < iVar24 && order_begin < uVar22) &&
         (lVar26 = WindowCursor::GetCell<long>(range_hi,0,uVar22 - 1), lVar26 <= lVar9)) {
        iVar24 = prev->end;
        if (lVar9 <= lVar26) goto LAB_011b056f;
        iVar24 = iVar24 + 1;
      }
    }
    ::std::function<bool_(long,_long)>::function
              ((function<bool_(long,_long)> *)&local_a0,(function<bool_(long,_long)> *)&local_78);
    WVar40.pos = order_begin;
    WVar40.coll = range_lo;
    __last_07.pos = iVar24;
    __last_07.coll = range_hi;
    WVar40 = ::std::
             upper_bound<duckdb::WindowColumnIterator<long>,long,duckdb::OperationCompare<long,duckdb::GreaterThan>>
                       (WVar40,__last_07,(long *)&local_58,
                        (OperationCompare<long,_duckdb::GreaterThan> *)&local_a0);
    iVar24 = WVar40.pos;
    if ((code *)local_90._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_90._M_allocated_capacity)(&local_a0,&local_a0,3);
    }
LAB_011b056f:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar24;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar24;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_011af03d_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_78._M_unused._M_object = &local_68;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Unsupported column type for RANGE","");
    InternalException::InternalException(this,(string *)&local_78);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_40._4_12_ = auVar10;
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar24 = local_80;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_58.months = *(int32_t *)(pvVar18->data + chunk_idx * 4);
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40.lower._0_4_ = WindowCursor::GetCell<float>(range_hi,0,local_80 - 1);
      bVar13 = GreaterThan::Operation<float>((float *)&local_40,(float *)&local_58);
      if (bVar13) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40.lower._0_4_ = WindowCursor::GetCell<float>(range_lo,0,order_begin);
      iVar24 = local_80;
      bVar13 = GreaterThan::Operation<float>((float *)&local_58,(float *)&local_40);
      if (bVar13) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar22 = prev->end;
    if (uVar8 < uVar22) {
      if (uVar8 < iVar24 && order_begin <= uVar8) {
        WindowCursor::GetCell<float>(range_lo,0,uVar8);
        uVar22 = prev->end;
      }
      if (uVar22 < iVar24 && order_begin < uVar22) {
        fVar29 = WindowCursor::GetCell<float>(range_hi,0,uVar22 - 1);
        local_a0._0_4_ = fVar29;
        bVar13 = GreaterThan::Operation<float>((float *)&local_a0,(float *)&local_58);
        if (!bVar13) {
          bVar13 = GreaterThan::Operation<float>((float *)&local_58,(float *)&local_a0);
          iVar24 = prev->end;
          if (!bVar13) goto LAB_011b0689;
          iVar24 = iVar24 + 1;
        }
      }
    }
    ::std::function<bool_(float,_float)>::function
              ((function<bool_(float,_float)> *)&local_a0,(function<bool_(float,_float)> *)&local_78
              );
    WVar41.pos = order_begin;
    WVar41.coll = range_lo;
    __last_08.pos = iVar24;
    __last_08.coll = range_hi;
    WVar41 = ::std::
             upper_bound<duckdb::WindowColumnIterator<float>,float,duckdb::OperationCompare<float,duckdb::GreaterThan>>
                       (WVar41,__last_08,(float *)&local_58,
                        (OperationCompare<float,_duckdb::GreaterThan> *)&local_a0);
    iVar24 = WVar41.pos;
    if ((code *)local_90._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_90._M_allocated_capacity)(&local_a0,&local_a0,3);
    }
LAB_011b0689:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar24;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar24;
  case DOUBLE:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar24 = local_80;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_58._0_8_ = *(undefined8 *)(pvVar18->data + chunk_idx * 8);
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40.lower = (uint64_t)WindowCursor::GetCell<double>(range_hi,0,local_80 - 1);
      bVar13 = GreaterThan::Operation<double>((double *)&local_40,(double *)&local_58);
      if (bVar13) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40.lower = (uint64_t)WindowCursor::GetCell<double>(range_lo,0,order_begin);
      iVar24 = local_80;
      bVar13 = GreaterThan::Operation<double>((double *)&local_58,(double *)&local_40);
      if (bVar13) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar22 = prev->end;
    if (uVar8 < uVar22) {
      if (uVar8 < iVar24 && order_begin <= uVar8) {
        WindowCursor::GetCell<double>(range_lo,0,uVar8);
        uVar22 = prev->end;
      }
      if (uVar22 < iVar24 && order_begin < uVar22) {
        local_a0._M_unused._0_8_ = (undefined8)WindowCursor::GetCell<double>(range_hi,0,uVar22 - 1);
        bVar13 = GreaterThan::Operation<double>((double *)&local_a0,(double *)&local_58);
        if (!bVar13) {
          bVar13 = GreaterThan::Operation<double>((double *)&local_58,(double *)&local_a0);
          iVar24 = prev->end;
          if (!bVar13) goto LAB_011b0489;
          iVar24 = iVar24 + 1;
        }
      }
    }
    ::std::function<bool_(double,_double)>::function
              ((function<bool_(double,_double)> *)&local_a0,
               (function<bool_(double,_double)> *)&local_78);
    WVar39.pos = order_begin;
    WVar39.coll = range_lo;
    __last_06.pos = iVar24;
    __last_06.coll = range_hi;
    WVar39 = ::std::
             upper_bound<duckdb::WindowColumnIterator<double>,double,duckdb::OperationCompare<double,duckdb::GreaterThan>>
                       (WVar39,__last_06,(double *)&local_58,
                        (OperationCompare<double,_duckdb::GreaterThan> *)&local_a0);
    iVar24 = WVar39.pos;
    if ((code *)local_90._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_90._M_allocated_capacity)(&local_a0,&local_a0,3);
    }
LAB_011b0489:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar24;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar24;
  case INTERVAL:
    break;
  default:
    if (PVar1 != UINT128) {
      if (PVar1 != INT128) goto switchD_011af03d_caseD_a;
      pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
      iVar24 = local_80;
      if (boundary->scalar != false) {
        chunk_idx = 0;
      }
      uVar8 = *(ulong *)(pvVar18->data + chunk_idx * 0x10);
      lVar9 = *(long *)(pvVar18->data + chunk_idx * 0x10 + 8);
      local_68._M_allocated_capacity = 0;
      local_68._8_8_ = 0;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_58._0_8_ = uVar8;
      local_58.micros = lVar9;
      if (range == EXPR_PRECEDING_RANGE) {
        hVar30 = WindowCursor::GetCell<duckdb::hugeint_t>(range_hi,0,local_80 - 1);
        if ((lVar9 < hVar30.upper) || (uVar8 < hVar30.lower && hVar30.upper == lVar9)) {
          pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_a0._M_unused._M_object = &local_90;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"Invalid RANGE PRECEDING value","");
          OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
          __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        hVar30 = WindowCursor::GetCell<duckdb::hugeint_t>(range_lo,0,order_begin);
        if ((hVar30.upper < lVar9) ||
           (iVar24 = local_80, hVar30.lower < uVar8 && lVar9 == hVar30.upper)) {
          pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_a0._M_unused._M_object = &local_90;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"Invalid RANGE FOLLOWING value","");
          OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
          __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      uVar22 = prev->start;
      uVar23 = prev->end;
      if (uVar22 < uVar23) {
        if (uVar22 < iVar24 && order_begin <= uVar22) {
          WindowCursor::GetCell<duckdb::hugeint_t>(range_lo,0,uVar22);
          uVar23 = prev->end;
        }
        if (uVar23 < iVar24 && order_begin < uVar23) {
          hVar30 = WindowCursor::GetCell<duckdb::hugeint_t>(range_hi,0,uVar23 - 1);
          lVar26 = hVar30.upper;
          if ((lVar26 <= lVar9) && (hVar30.lower <= uVar8 || lVar26 != lVar9)) {
            iVar24 = prev->end;
            if ((lVar9 <= lVar26) && (uVar8 <= hVar30.lower || lVar26 != lVar9)) goto LAB_011b08db;
            iVar24 = iVar24 + 1;
          }
        }
      }
      ::std::function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)>::function
                ((function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&local_a0,
                 (function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&local_78);
      WVar43.pos = order_begin;
      WVar43.coll = range_lo;
      __last_10.pos = iVar24;
      __last_10.coll = range_hi;
      WVar43 = ::std::
               upper_bound<duckdb::WindowColumnIterator<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::OperationCompare<duckdb::hugeint_t,duckdb::GreaterThan>>
                         (WVar43,__last_10,(hugeint_t *)&local_58,
                          (OperationCompare<duckdb::hugeint_t,_duckdb::GreaterThan> *)&local_a0);
      iVar24 = WVar43.pos;
      if ((code *)local_90._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_90._M_allocated_capacity)(&local_a0,&local_a0,3);
      }
LAB_011b08db:
      if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
        return iVar24;
      }
      (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
      return iVar24;
    }
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar24 = local_80;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_58._0_8_ = *(undefined8 *)(pvVar18->data + chunk_idx * 0x10);
    local_58.micros = *(int64_t *)(pvVar18->data + chunk_idx * 0x10 + 8);
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40 = WindowCursor::GetCell<duckdb::uhugeint_t>(range_hi,0,local_80 - 1);
      bVar13 = uhugeint_t::operator>(&local_40,(uhugeint_t *)&local_58);
      if (bVar13) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40 = WindowCursor::GetCell<duckdb::uhugeint_t>(range_lo,0,order_begin);
      iVar24 = local_80;
      bVar13 = uhugeint_t::operator>((uhugeint_t *)&local_58,&local_40);
      if (bVar13) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_unused._M_object = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar22 = prev->end;
    if (uVar8 < uVar22) {
      if (uVar8 < iVar24 && order_begin <= uVar8) {
        WindowCursor::GetCell<duckdb::uhugeint_t>(range_lo,0,uVar8);
        uVar22 = prev->end;
      }
      if (uVar22 < iVar24 && order_begin < uVar22) {
        local_a0 = (_Any_data)WindowCursor::GetCell<duckdb::uhugeint_t>(range_hi,0,uVar22 - 1);
        bVar13 = uhugeint_t::operator>((uhugeint_t *)&local_a0,(uhugeint_t *)&local_58);
        if (!bVar13) {
          bVar13 = uhugeint_t::operator>((uhugeint_t *)&local_58,(uhugeint_t *)&local_a0);
          iVar24 = prev->end;
          if (!bVar13) goto LAB_011b07a9;
          iVar24 = iVar24 + 1;
        }
      }
    }
    ::std::function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)>::function
              ((function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&local_a0,
               (function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&local_78);
    WVar42.pos = order_begin;
    WVar42.coll = range_lo;
    __last_09.pos = iVar24;
    __last_09.coll = range_hi;
    WVar42 = ::std::
             upper_bound<duckdb::WindowColumnIterator<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::OperationCompare<duckdb::uhugeint_t,duckdb::GreaterThan>>
                       (WVar42,__last_09,(uhugeint_t *)&local_58,
                        (OperationCompare<duckdb::uhugeint_t,_duckdb::GreaterThan> *)&local_a0);
    iVar24 = WVar42.pos;
    if ((code *)local_90._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_90._M_allocated_capacity)(&local_a0,&local_a0,3);
    }
LAB_011b07a9:
    if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
      return iVar24;
    }
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    return iVar24;
  }
  pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
  iVar24 = local_80;
  if (boundary->scalar != false) {
    chunk_idx = 0;
  }
  local_58._0_8_ = *(undefined8 *)(pvVar18->data + chunk_idx * 0x10);
  lVar9 = *(long *)(pvVar18->data + chunk_idx * 0x10 + 8);
  local_68._M_allocated_capacity = 0;
  local_68._8_8_ = 0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_58.micros = lVar9;
  local_48 = local_58._0_8_;
  if (range == EXPR_PRECEDING_RANGE) {
    iVar31 = WindowCursor::GetCell<duckdb::interval_t>(range_hi,0,local_80 - 1);
    lVar26 = (iVar31._0_8_ >> 0x20) + iVar31.micros / 86400000000;
    lVar25 = lVar26 % 0x1e;
    lVar27 = (long)iVar31.months + lVar26 / 0x1e;
    lVar21 = (local_48 >> 0x20) + lVar9 / 86400000000;
    lVar26 = lVar21 % 0x1e;
    lVar21 = (long)(int)local_48 + lVar21 / 0x1e;
    if ((lVar21 < lVar27) ||
       ((lVar21 <= lVar27 &&
        ((lVar26 < lVar25 ||
         ((lVar26 <= lVar25 && (lVar9 % 86400000000 < iVar31.micros % 86400000000)))))))) {
      pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_a0._M_unused._M_object = &local_90;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Invalid RANGE PRECEDING value","");
      OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
      __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar31 = WindowCursor::GetCell<duckdb::interval_t>(range_lo,0,order_begin);
    lVar26 = (local_48 >> 0x20) + lVar9 / 86400000000;
    lVar25 = lVar26 % 0x1e;
    lVar27 = (long)(int)local_48 + lVar26 / 0x1e;
    lVar21 = (iVar31._0_8_ >> 0x20) + iVar31.micros / 86400000000;
    lVar26 = lVar21 % 0x1e;
    lVar21 = (long)iVar31.months + lVar21 / 0x1e;
    if ((lVar21 < lVar27) ||
       ((iVar24 = local_80, lVar21 <= lVar27 &&
        ((lVar26 < lVar25 ||
         ((lVar26 <= lVar25 && (iVar31.micros % 86400000000 < lVar9 % 86400000000)))))))) {
      pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_a0._M_unused._M_object = &local_90;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Invalid RANGE FOLLOWING value","");
      OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_a0);
      __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  uVar8 = prev->start;
  uVar22 = prev->end;
  if (uVar8 < uVar22) {
    if (uVar8 < iVar24 && order_begin <= uVar8) {
      WindowCursor::GetCell<duckdb::interval_t>(range_lo,0,uVar8);
      uVar22 = prev->end;
    }
    if (uVar22 < iVar24 && order_begin < uVar22) {
      iVar31 = WindowCursor::GetCell<duckdb::interval_t>(range_hi,0,uVar22 - 1);
      lVar26 = (iVar31._0_8_ >> 0x20) + iVar31.micros / 86400000000;
      lVar28 = iVar31.micros % 86400000000;
      lVar25 = lVar26 % 0x1e;
      lVar27 = (long)iVar31.months + lVar26 / 0x1e;
      lVar21 = (local_48 >> 0x20) + lVar9 / 86400000000;
      lVar26 = lVar21 % 0x1e;
      lVar21 = (long)(int)local_48 + lVar21 / 0x1e;
      if (lVar27 <= lVar21) {
        if (lVar21 <= lVar27) {
          if ((lVar26 < lVar25) || ((lVar26 <= lVar25 && (lVar9 % 86400000000 < lVar28))))
          goto LAB_011b0902;
          if ((lVar26 <= lVar25) && (lVar9 % 86400000000 <= lVar28)) {
            iVar24 = prev->end;
            goto LAB_011b0948;
          }
        }
        iVar24 = prev->end + 1;
      }
    }
  }
LAB_011b0902:
  ::std::function<bool_(duckdb::interval_t,_duckdb::interval_t)>::function
            ((function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&local_a0,
             (function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&local_78);
  WVar44.pos = order_begin;
  WVar44.coll = range_lo;
  __last_11.pos = iVar24;
  __last_11.coll = range_hi;
  WVar44 = ::std::
           upper_bound<duckdb::WindowColumnIterator<duckdb::interval_t>,duckdb::interval_t,duckdb::OperationCompare<duckdb::interval_t,duckdb::GreaterThan>>
                     (WVar44,__last_11,&local_58,
                      (OperationCompare<duckdb::interval_t,_duckdb::GreaterThan> *)&local_a0);
  iVar24 = WVar44.pos;
  if ((code *)local_90._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_90._M_allocated_capacity)(&local_a0,&local_a0,3);
  }
LAB_011b0948:
  if ((code *)local_68._M_allocated_capacity == (code *)0x0) {
    return iVar24;
  }
  (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
  return iVar24;
}

Assistant:

static idx_t FindRangeBound(WindowCursor &range_lo, WindowCursor &range_hi, const idx_t order_begin,
                            const idx_t order_end, const WindowBoundary range, WindowInputExpression &boundary,
                            const idx_t chunk_idx, const FrameBounds &prev) {
	switch (boundary.InternalType()) {
	case PhysicalType::INT8:
		return FindTypedRangeBound<int8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INT16:
		return FindTypedRangeBound<int16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT32:
		return FindTypedRangeBound<int32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT64:
		return FindTypedRangeBound<int64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT8:
		return FindTypedRangeBound<uint8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT16:
		return FindTypedRangeBound<uint16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT32:
		return FindTypedRangeBound<uint32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT64:
		return FindTypedRangeBound<uint64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::INT128:
		return FindTypedRangeBound<hugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                chunk_idx, prev);
	case PhysicalType::UINT128:
		return FindTypedRangeBound<uhugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	case PhysicalType::FLOAT:
		return FindTypedRangeBound<float, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                            chunk_idx, prev);
	case PhysicalType::DOUBLE:
		return FindTypedRangeBound<double, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INTERVAL:
		return FindTypedRangeBound<interval_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	default:
		throw InternalException("Unsupported column type for RANGE");
	}
}